

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtransform.cpp
# Opt level: O2

bool QTransform::squareToQuad(QPolygonF *quad,QTransform *trans)

{
  ulong uVar1;
  QPointF *pQVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  bool bVar9;
  qreal qVar10;
  qreal qVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  
  uVar1 = (quad->super_QList<QPointF>).d.size;
  bVar9 = QPolygonF::isClosed(quad);
  if (uVar1 == ((ulong)bVar9 | 4)) {
    pQVar2 = (quad->super_QList<QPointF>).d.ptr;
    dVar3 = pQVar2->xp;
    dVar4 = pQVar2->yp;
    dVar5 = pQVar2[1].xp;
    dVar6 = pQVar2[1].yp;
    dVar16 = pQVar2[2].xp;
    dVar18 = pQVar2[2].yp;
    dVar7 = pQVar2[3].xp;
    dVar8 = pQVar2[3].yp;
    dVar14 = ((dVar3 - dVar5) + dVar16) - dVar7;
    dVar15 = ((dVar4 - dVar6) + dVar18) - dVar8;
    if ((((dVar14 != 0.0) || (NAN(dVar14))) || (dVar15 != 0.0)) || (NAN(dVar15))) {
      dVar17 = (dVar8 - dVar18) * (dVar5 - dVar16) - (dVar6 - dVar18) * (dVar7 - dVar16);
      if ((dVar17 == 0.0) && (!NAN(dVar17))) goto LAB_003dd724;
      auVar12._0_8_ = (dVar8 - dVar18) * dVar14 + -(dVar7 - dVar16) * dVar15;
      auVar12._8_8_ = (dVar5 - dVar16) * dVar15 + -dVar14 * (dVar6 - dVar18);
      auVar13._8_8_ = dVar17;
      auVar13._0_8_ = dVar17;
      auVar13 = divpd(auVar12,auVar13);
      qVar10 = (dVar5 - dVar3) + auVar13._0_8_ * dVar5;
      qVar11 = (dVar6 - dVar4) + auVar13._0_8_ * dVar6;
      dVar16 = (dVar7 - dVar3) + auVar13._8_8_ * dVar7;
      dVar18 = (dVar8 - dVar4) + auVar13._8_8_ * dVar8;
    }
    else {
      dVar16 = dVar16 - dVar5;
      dVar18 = dVar18 - dVar6;
      qVar10 = dVar5 - dVar3;
      qVar11 = dVar6 - dVar4;
      auVar13 = ZEXT816(0);
    }
    trans->m_matrix[0][0] = qVar10;
    trans->m_matrix[0][1] = qVar11;
    trans->m_matrix[0][2] = auVar13._0_8_;
    trans->m_matrix[1][0] = dVar16;
    trans->m_matrix[1][1] = dVar18;
    trans->m_matrix[1][2] = auVar13._8_8_;
    trans->m_matrix[2][0] = dVar3;
    trans->m_matrix[2][1] = dVar4;
    trans->m_matrix[2][2] = 1.0;
    *(ushort *)&trans->field_0x48 = (ushort)*(undefined4 *)&trans->field_0x48 & 0xfc00 | 0x200;
    bVar9 = true;
  }
  else {
LAB_003dd724:
    bVar9 = false;
  }
  return bVar9;
}

Assistant:

bool QTransform::squareToQuad(const QPolygonF &quad, QTransform &trans)
{
    if (quad.size() != (quad.isClosed() ? 5 : 4))
        return false;

    qreal dx0 = quad[0].x();
    qreal dx1 = quad[1].x();
    qreal dx2 = quad[2].x();
    qreal dx3 = quad[3].x();

    qreal dy0 = quad[0].y();
    qreal dy1 = quad[1].y();
    qreal dy2 = quad[2].y();
    qreal dy3 = quad[3].y();

    double ax  = dx0 - dx1 + dx2 - dx3;
    double ay  = dy0 - dy1 + dy2 - dy3;

    if (!ax && !ay) { //afine transform
        trans.setMatrix(dx1 - dx0, dy1 - dy0,  0,
                        dx2 - dx1, dy2 - dy1,  0,
                        dx0,       dy0,  1);
    } else {
        double ax1 = dx1 - dx2;
        double ax2 = dx3 - dx2;
        double ay1 = dy1 - dy2;
        double ay2 = dy3 - dy2;

        /*determinants */
        double gtop    =  ax  * ay2 - ax2 * ay;
        double htop    =  ax1 * ay  - ax  * ay1;
        double bottom  =  ax1 * ay2 - ax2 * ay1;

        double a, b, c, d, e, f, g, h;  /*i is always 1*/

        if (!bottom)
            return false;

        g = gtop/bottom;
        h = htop/bottom;

        a = dx1 - dx0 + g * dx1;
        b = dx3 - dx0 + h * dx3;
        c = dx0;
        d = dy1 - dy0 + g * dy1;
        e = dy3 - dy0 + h * dy3;
        f = dy0;

        trans.setMatrix(a, d, g,
                        b, e, h,
                        c, f, 1.0);
    }

    return true;
}